

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O2

void __thiscall FTOutline::convert(FTOutline *this,VPath *path)

{
  model *pmVar1;
  pointer pEVar2;
  pointer pVVar3;
  size_t segments;
  long lVar4;
  VPointF *cp1;
  pointer pEVar5;
  
  pmVar1 = (path->d).mModel;
  cp1 = (VPointF *)
        ((long)(pmVar1->mValue).m_points.super__Vector_base<VPointF,_std::allocator<VPointF>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(pmVar1->mValue).m_points.super__Vector_base<VPointF,_std::allocator<VPointF>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3);
  segments = VPath::segments(path);
  grow(this,(size_t)cp1,segments);
  pEVar5 = (pmVar1->mValue).m_elements.
           super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (pmVar1->mValue).m_elements.
           super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = 0;
  do {
    if (pEVar5 == pEVar2) {
      end(this);
      return;
    }
    switch(*pEVar5) {
    case MoveTo:
      cp1 = (pmVar1->mValue).m_points.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
            super__Vector_impl_data._M_start + lVar4;
      moveTo(this,cp1);
      goto LAB_0011534d;
    case LineTo:
      cp1 = (pmVar1->mValue).m_points.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
            super__Vector_impl_data._M_start + lVar4;
      lineTo(this,cp1);
LAB_0011534d:
      lVar4 = lVar4 + 1;
      break;
    case CubicTo:
      pVVar3 = (pmVar1->mValue).m_points.super__Vector_base<VPointF,_std::allocator<VPointF>_>.
               _M_impl.super__Vector_impl_data._M_start;
      cp1 = pVVar3 + lVar4;
      cubicTo(this,cp1,pVVar3 + lVar4 + 1,pVVar3[lVar4 + 2]);
      lVar4 = lVar4 + 3;
      break;
    case Close:
      close(this,(int)cp1);
    }
    pEVar5 = pEVar5 + 1;
  } while( true );
}

Assistant:

void FTOutline::convert(const VPath &path)
{
    const std::vector<VPath::Element> &elements = path.elements();
    const std::vector<VPointF> &       points = path.points();

    grow(points.size(), path.segments());

    size_t index = 0;
    for (auto element : elements) {
        switch (element) {
        case VPath::Element::MoveTo:
            moveTo(points[index]);
            index++;
            break;
        case VPath::Element::LineTo:
            lineTo(points[index]);
            index++;
            break;
        case VPath::Element::CubicTo:
            cubicTo(points[index], points[index + 1], points[index + 2]);
            index = index + 3;
            break;
        case VPath::Element::Close:
            close();
            break;
        }
    }
    end();
}